

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O0

void OpenSteer::
     PointToPathAlikeMapping<OpenSteer::PolylineSegmentedPath,_OpenSteer::PointToPathMapping,_OpenSteer::PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPath>_>
     ::map(PolylineSegmentedPath *pathAlike,Vec3 *queryPoint,PointToPathMapping *mapping)

{
  PolylineSegmentedPath *this;
  PolylineSegmentedPath *in_RDX;
  long *in_RDI;
  float fVar1;
  Vec3 VVar2;
  Vec3 tangent;
  Vec3 pointOnPathCenterLine;
  float distancePointToPath;
  float radius;
  float segmentDistance;
  size_type segmentIndex;
  size_type segmentCount;
  float minDistancePointToPath;
  PolylineSegmentedPath *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  Vec3 *in_stack_ffffffffffffff18;
  PolylineSegmentedPath *in_stack_ffffffffffffff20;
  Vec3 *in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Vec3 *local_60;
  float local_58;
  Vec3 local_54;
  Vec3 local_48;
  float local_3c;
  float local_38;
  float local_34;
  ulong local_30;
  ulong local_28;
  float local_1c;
  PolylineSegmentedPath *local_18;
  long *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_1c = std::numeric_limits<float>::max();
  DontExtractPathDistance::setDistanceOnPathFlag((DontExtractPathDistance *)local_18,0.0);
  local_28 = (**(code **)(*local_8 + 0x50))();
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    local_34 = 0.0;
    local_38 = 0.0;
    local_3c = 0.0;
    Vec3::Vec3(&local_48,0.0,0.0,0.0);
    Vec3::Vec3(&local_54,0.0,0.0,0.0);
    PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPath>::extract
              (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
               (Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (float *)in_stack_ffffffffffffff08,&local_54.x,&local_48.x,in_stack_ffffffffffffff30,
               (Vec3 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (local_3c < local_1c) {
      local_1c = local_3c;
      in_stack_ffffffffffffff18 = &local_48;
      PointToPathMapping::setPointOnPathCenterLine
                ((PointToPathMapping *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff20 = local_18;
      Vec3::operator-((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (Vec3 *)in_stack_ffffffffffffff08);
      Vec3::normalize((Vec3 *)in_stack_ffffffffffffff20);
      Vec3::operator*((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (float)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      VVar2 = Vec3::operator+((Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (Vec3 *)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff30 = VVar2._0_8_;
      in_stack_ffffffffffffff38 = VVar2.z;
      local_60 = in_stack_ffffffffffffff30;
      local_58 = in_stack_ffffffffffffff38;
      PointToPathMapping::setPointOnPathBoundary
                ((PointToPathMapping *)in_stack_ffffffffffffff20,(Vec3 *)&local_60);
      PointToPathMapping::setRadius((PointToPathMapping *)local_18,local_38);
      PointToPathMapping::setTangent
                ((PointToPathMapping *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      PointToPathMapping::setSegmentIndex((PointToPathMapping *)local_18,local_30);
      PointToPathMapping::setDistancePointToPath((PointToPathMapping *)local_18,local_3c);
      PointToPathMapping::setDistancePointToPathCenterLine
                ((PointToPathMapping *)local_18,local_3c + local_38);
      this = local_18;
      fVar1 = DontExtractPathDistance::distanceOnPathFlag((DontExtractPathDistance *)local_18);
      PointToPathMapping::setDistanceOnPath((PointToPathMapping *)this,fVar1 + local_34);
      PointToPathMapping::setDistanceOnSegment((PointToPathMapping *)local_18,local_34);
    }
    in_stack_ffffffffffffff08 = local_18;
    in_stack_ffffffffffffff14 =
         DontExtractPathDistance::distanceOnPathFlag((DontExtractPathDistance *)local_18);
    fVar1 = (float)(**(code **)(*local_8 + 0x58))(local_8,local_30);
    DontExtractPathDistance::setDistanceOnPathFlag
              ((DontExtractPathDistance *)in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff14 + fVar1);
  }
  return;
}

Assistant:

static void map( PathAlike const& pathAlike, Vec3 const& queryPoint, Mapping& mapping ) {
            float minDistancePointToPath = std::numeric_limits< float >::max();
            mapping.setDistanceOnPathFlag( 0.0f );
            
            typedef typename PathAlike::size_type size_type;
            size_type const segmentCount = pathAlike.segmentCount();
            for ( size_type segmentIndex = 0; segmentIndex < segmentCount; ++segmentIndex ) {
                
                float segmentDistance = 0.0f;
                float radius = 0.0f;
                float distancePointToPath = 0.0f;
                Vec3 pointOnPathCenterLine( 0.0f, 0.0f, 0.0f );
                Vec3 tangent( 0.0f, 0.0f, 0.0f );
                
                BaseDataExtractionPolicy::extract( pathAlike, segmentIndex, queryPoint, segmentDistance, radius, distancePointToPath, pointOnPathCenterLine, tangent );
                
                if ( distancePointToPath < minDistancePointToPath ) {
                    minDistancePointToPath = distancePointToPath;
                    mapping.setPointOnPathCenterLine( pointOnPathCenterLine );
                    mapping.setPointOnPathBoundary( pointOnPathCenterLine + ( ( queryPoint - pointOnPathCenterLine ).normalize() * radius ) );
                    mapping.setRadius( radius );
                    mapping.setTangent( tangent );
                    mapping.setSegmentIndex( segmentIndex );
                    mapping.setDistancePointToPath( distancePointToPath );
                    mapping.setDistancePointToPathCenterLine( distancePointToPath + radius );
                    mapping.setDistanceOnPath( mapping.distanceOnPathFlag() + segmentDistance );
                    mapping.setDistanceOnSegment( segmentDistance );
                }
                
                mapping.setDistanceOnPathFlag( mapping.distanceOnPathFlag() + pathAlike.segmentLength( segmentIndex ) );
            }
        }